

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.cc
# Opt level: O1

string * tinyusdz::fmt::format(string *__return_storage_ptr__,string *in)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (in->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + in->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &in) { return in; }